

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

bool google::AppendFlagsIntoFile(string *filename,char *prog_name)

{
  pointer pCVar1;
  int iVar2;
  FILE *__stream;
  int *piVar3;
  vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> *extraout_RDX;
  vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> *extraout_RDX_00
  ;
  vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> *extraout_RDX_01
  ;
  vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> *flags_00;
  iterator __position;
  bool bVar4;
  vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> flags;
  vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> local_68;
  string local_48;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"a");
  bVar4 = true;
  if (__stream == (FILE *)0x0) {
    piVar3 = __errno_location();
    bVar4 = *piVar3 == 0;
  }
  if (bVar4 != false) {
    if (prog_name != (char *)0x0) {
      fprintf(__stream,"%s\n",prog_name);
    }
    local_68.
    super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (CommandLineFlagInfo *)0x0;
    local_68.
    super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (CommandLineFlagInfo *)0x0;
    local_68.
    super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetAllFlags(&local_68);
    pCVar1 = local_68.
             super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    flags_00 = extraout_RDX;
    for (__position._M_current =
              local_68.
              super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
              ._M_impl.super__Vector_impl_data._M_start; __position._M_current != pCVar1;
        __position._M_current = __position._M_current + 1) {
      iVar2 = strcmp(((__position._M_current)->name)._M_dataplus._M_p,"flagfile");
      if (iVar2 == 0) {
        std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>::
        _M_erase(&local_68,__position);
        flags_00 = extraout_RDX_01;
        break;
      }
      flags_00 = extraout_RDX_00;
    }
    TheseCommandlineFlagsIntoString_abi_cxx11_(&local_48,(google *)&local_68,flags_00);
    fputs(local_48._M_dataplus._M_p,__stream);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    fclose(__stream);
    std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>::~vector
              (&local_68);
  }
  return bVar4;
}

Assistant:

bool AppendFlagsIntoFile(const string& filename, const char *prog_name) {
  FILE *fp;
  if (SafeFOpen(&fp, filename.c_str(), "a") != 0) {
    return false;
  }

  if (prog_name)
    fprintf(fp, "%s\n", prog_name);

  vector<CommandLineFlagInfo> flags;
  GetAllFlags(&flags);
  // But we don't want --flagfile, which leads to weird recursion issues
  vector<CommandLineFlagInfo>::iterator i;
  for (i = flags.begin(); i != flags.end(); ++i) {
    if (strcmp(i->name.c_str(), "flagfile") == 0) {
      flags.erase(i);
      break;
    }
  }
  fprintf(fp, "%s", TheseCommandlineFlagsIntoString(flags).c_str());

  fclose(fp);
  return true;
}